

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemapregisterrange.h
# Opt level: O1

CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
 __thiscall
snmalloc::
PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>
::Type<snmalloc::PalRange<snmalloc::PALLinux>_>::alloc_range
          (Type<snmalloc::PalRange<snmalloc::PALLinux>_> *this,size_t size)

{
  void *p;
  
  if (size + 0xbfffffffffffffff < 0xc000000000000000) {
    p = (void *)0x0;
  }
  else {
    p = PALLinux::reserve(size);
  }
  if (p != (void *)0x0) {
    FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
    ::register_range(&BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                      ::concretePagemap,(address_t)p,size);
  }
  return (CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          )p;
}

Assistant:

CapPtr<void, ChunkBounds> alloc_range(size_t size)
      {
        auto base = parent.alloc_range(size);

        if (base != nullptr)
        {
          Pagemap::register_range(base, size);
        }

        return base;
      }